

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O1

bool __thiscall
cmExportCommand::InitialPass
          (cmExportCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  long *plVar7;
  cmGlobalGenerator *this_00;
  cmTarget *pcVar8;
  cmExportBuildFileGenerator *pcVar9;
  iterator iVar10;
  cmExportSet *pcVar11;
  _Rb_tree_header *p_Var12;
  cmCommandArgument *this_01;
  string *psVar13;
  pointer pbVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  undefined1 local_258 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  string local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  undefined1 local_1e0 [112];
  ios_base local_170 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) < 0x21) {
    local_1e0._0_8_ = local_1e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"called with too few arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1e0);
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
    return false;
  }
  iVar4 = std::__cxx11::string::compare((char *)pbVar14);
  if (iVar4 == 0) {
    bVar3 = HandlePackage(this,args);
    return bVar3;
  }
  iVar4 = std::__cxx11::string::compare
                    ((char *)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  this_01 = &(this->ExportSetName).super_cmCommandArgument;
  if (iVar4 != 0) {
    this_01 = &(this->Targets).super_cmCommandArgument;
  }
  cmCommandArgument::Follows(this_01,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows(&this->ArgumentGroup,this_01);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCommandArgumentsHelper::Parse(&(this->super_cmCommand).Helper,args,&local_68);
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1e0._0_8_ = local_1e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"Unknown arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1e0);
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
    bVar3 = false;
    goto LAB_0038cdbd;
  }
  paVar1 = &local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_218._M_dataplus._M_p = (pointer)paVar1;
  if ((this->Filename).super_cmCommandArgument.WasActive == false) {
    iVar4 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar4 == 0) {
      pcVar2 = (this->ExportSetName).String._M_dataplus._M_p;
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1e0,pcVar2,pcVar2 + (this->ExportSetName).String._M_string_length);
      std::__cxx11::string::append(local_1e0);
      std::__cxx11::string::operator=((string *)&local_218,(string *)local_1e0);
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
      goto LAB_0038c85b;
    }
    local_1e0._0_8_ = local_1e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"FILE <filename> option missing.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1e0);
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
LAB_0038c7de:
    bVar3 = false;
  }
  else {
    std::__cxx11::string::string
              ((string *)local_258,(this->Filename).String._M_dataplus._M_p,
               (allocator *)local_238._M_local_buf);
    cmsys::SystemTools::GetFilenameLastExtension((string *)local_1e0,(string *)local_258);
    iVar4 = std::__cxx11::string::compare(local_1e0);
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
    if ((string *)local_258._0_8_ != (string *)(local_258 + 0x10)) {
      operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
    }
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e0,"FILE option given filename \"",0x1c);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1e0,(this->Filename).String._M_dataplus._M_p,
                          (this->Filename).String._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"\" which does not have an extension of \".cmake\".\n",0x30);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)local_258);
      if ((string *)local_258._0_8_ != (string *)(local_258 + 0x10)) {
LAB_0038c753:
        operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
      }
LAB_0038c760:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      std::ios_base::~ios_base(local_170);
      goto LAB_0038c7de;
    }
    std::__cxx11::string::_M_assign((string *)&local_218);
LAB_0038c85b:
    bVar3 = cmsys::SystemTools::FileIsFullPath(local_218._M_dataplus._M_p);
    if (bVar3) {
      bVar3 = cmMakefile::CanIWriteThisFile
                        ((this->super_cmCommand).Makefile,local_218._M_dataplus._M_p);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e0,"FILE option given filename \"",0x1c);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1e0,local_218._M_dataplus._M_p,
                            local_218._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\" which is in the source tree.\n",0x1f);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_258);
        if ((string *)local_258._0_8_ != (string *)(local_258 + 0x10)) goto LAB_0038c753;
        goto LAB_0038c760;
      }
    }
    else {
      pcVar6 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)local_1e0,pcVar6,(allocator *)local_258);
      local_238._M_allocated_capacity = (size_type)&local_228;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_1e0._0_8_,(pointer)(local_1e0._0_8_ + local_1e0._8_8_));
      std::__cxx11::string::append(local_238._M_local_buf);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 (local_238._M_local_buf,(ulong)local_218._M_dataplus._M_p);
      psVar13 = (string *)(plVar7 + 2);
      if ((string *)*plVar7 == psVar13) {
        local_258._16_8_ = (psVar13->_M_dataplus)._M_p;
        local_258._24_8_ = plVar7[3];
        local_258._0_8_ = (string *)(local_258 + 0x10);
      }
      else {
        local_258._16_8_ = (psVar13->_M_dataplus)._M_p;
        local_258._0_8_ = (string *)*plVar7;
      }
      local_258._8_8_ = plVar7[1];
      *plVar7 = (long)psVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_218,(string *)local_258);
      if ((string *)local_258._0_8_ != (string *)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_allocated_capacity != &local_228) {
        operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1)
        ;
      }
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
    }
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    iVar4 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar4 == 0) {
      if ((this->Append).Enabled == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e0,"EXPORT signature does not recognise the APPEND option.",
                   0x36);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_258);
      }
      else {
        if ((this->ExportOld).Enabled != true) {
          local_258._0_8_ = local_258 + 0x10;
          pcVar2 = (this->ExportSetName).String._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_258,pcVar2,
                     pcVar2 + (this->ExportSetName).String._M_string_length);
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                           *)&this_00->ExportSets,(key_type *)local_258);
          p_Var12 = &(this_00->ExportSets).
                     super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                     ._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar10._M_node == p_Var12) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e0,"Export set \"",0xc);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1e0,(char *)local_258._0_8_,local_258._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" not found.",0xc);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)&local_238);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_allocated_capacity != &local_228) {
              operator_delete((void *)local_238._M_allocated_capacity,
                              local_228._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
            std::ios_base::~ios_base(local_170);
          }
          else {
            pcVar11 = cmExportSetMap::operator[](&this_00->ExportSets,(string *)local_258);
            this->ExportSet = pcVar11;
          }
          if ((string *)local_258._0_8_ != (string *)(local_258 + 0x10)) {
            operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
          }
          if ((_Rb_tree_header *)iVar10._M_node != p_Var12) goto LAB_0038cea1;
          goto LAB_0038cd9a;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e0,
                   "EXPORT signature does not recognise the EXPORT_LINK_INTERFACE_LIBRARIES option."
                   ,0x4f);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_258);
      }
LAB_0038cd61:
      if ((string *)local_258._0_8_ != (string *)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
      std::ios_base::~ios_base(local_170);
LAB_0038cd9a:
      bVar3 = false;
    }
    else {
      if ((this->Targets).super_cmCommandArgument.WasActive != true) {
        local_1e0._0_8_ = local_1e0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e0,"EXPORT or TARGETS specifier missing.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1e0);
        if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
          operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
        }
        goto LAB_0038cd9a;
      }
      pbVar14 = (this->Targets).Vector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar14 !=
          (this->Targets).Vector.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          bVar3 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,pbVar14);
          if (bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e0,"given ALIAS target \"",0x14);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1e0,(pbVar14->_M_dataplus)._M_p,
                                pbVar14->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" which may not be exported.",0x1c);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_258);
            goto LAB_0038cd61;
          }
          pcVar8 = cmGlobalGenerator::FindTarget(this_00,pbVar14,false);
          if (pcVar8 == (cmTarget *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e0,"given target \"",0xe);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1e0,(pbVar14->_M_dataplus)._M_p,
                                pbVar14->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" which is not built by this project.",0x25);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_258);
            goto LAB_0038cd61;
          }
          if (pcVar8->TargetTypeValue == OBJECT_LIBRARY) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e0,"given OBJECT library \"",0x16);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1e0,(pbVar14->_M_dataplus)._M_p,
                                pbVar14->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" which may not be exported.",0x1c);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_258);
            goto LAB_0038cd61;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1f8,pbVar14);
          pbVar14 = pbVar14 + 1;
        } while (pbVar14 !=
                 (this->Targets).Vector.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (((this->Append).Enabled == true) &&
         (pcVar9 = cmGlobalGenerator::GetExportedTargetsFile(this_00,&local_218),
         pcVar9 != (cmExportBuildFileGenerator *)0x0)) {
        bVar3 = true;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pcVar9->Targets,
                   (pcVar9->Targets).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   local_1f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_1f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
LAB_0038cea1:
        pcVar9 = (cmExportBuildFileGenerator *)operator_new(0x170);
        cmExportBuildFileGenerator::cmExportBuildFileGenerator(pcVar9);
        cmExportFileGenerator::SetExportFile
                  ((cmExportFileGenerator *)pcVar9,local_218._M_dataplus._M_p);
        std::__cxx11::string::string
                  ((string *)local_1e0,(this->Namespace).String._M_dataplus._M_p,
                   (allocator *)local_258);
        std::__cxx11::string::_M_assign((string *)&(pcVar9->super_cmExportFileGenerator).Namespace);
        pcVar2 = local_1e0 + 0x10;
        if ((pointer)local_1e0._0_8_ != pcVar2) {
          operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
        }
        (pcVar9->super_cmExportFileGenerator).AppendMode = (this->Append).Enabled;
        if (this->ExportSet == (cmExportSet *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&pcVar9->Targets,&local_1f8);
        }
        else {
          cmExportBuildFileGenerator::SetExportSet(pcVar9,this->ExportSet);
        }
        cmExportBuildFileGenerator::SetMakefile(pcVar9,(this->super_cmCommand).Makefile);
        (pcVar9->super_cmExportFileGenerator).ExportOld = (this->ExportOld).Enabled;
        local_258._0_8_ = (string *)0x0;
        local_258._8_8_ = (string *)0x0;
        local_258._16_8_ = (pointer)0x0;
        cmMakefile::GetConfigurations
                  (&local_50,(this->super_cmCommand).Makefile,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_258,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        psVar13 = (string *)local_258._0_8_;
        if (local_258._0_8_ == local_258._8_8_) {
          local_1e0._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_258,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0)
          ;
          psVar13 = (string *)local_258._0_8_;
          if ((pointer)local_1e0._0_8_ != pcVar2) {
            operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
            psVar13 = (string *)local_258._0_8_;
          }
        }
        for (; psVar13 != (string *)local_258._8_8_; psVar13 = psVar13 + 1) {
          cmExportFileGenerator::AddConfiguration((cmExportFileGenerator *)pcVar9,psVar13);
        }
        if (this->ExportSet == (cmExportSet *)0x0) {
          cmGlobalGenerator::AddBuildExportSet(this_00,pcVar9);
        }
        else {
          cmGlobalGenerator::AddBuildExportExportSet(this_00,pcVar9);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_258);
        bVar3 = true;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,
                    CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                             local_218.field_2._M_local_buf[0]) + 1);
  }
LAB_0038cdbd:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return bVar3;
}

Assistant:

bool cmExportCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with too few arguments");
    return false;
    }

  if(args[0] == "PACKAGE")
    {
    return this->HandlePackage(args);
    }
  else if (args[0] == "EXPORT")
    {
    this->ExportSetName.Follows(0);
    this->ArgumentGroup.Follows(&this->ExportSetName);
    }
  else
    {
    this->Targets.Follows(0);
    this->ArgumentGroup.Follows(&this->Targets);
    }

  std::vector<std::string> unknownArgs;
  this->Helper.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty())
    {
    this->SetError("Unknown arguments.");
    return false;
    }

  std::string fname;
  if(!this->Filename.WasFound())
    {
    if (args[0] != "EXPORT")
      {
      this->SetError("FILE <filename> option missing.");
      return false;
      }
    fname = this->ExportSetName.GetString() + ".cmake";
    }
  else
    {
    // Make sure the file has a .cmake extension.
    if(cmSystemTools::GetFilenameLastExtension(this->Filename.GetCString())
      != ".cmake")
      {
      std::ostringstream e;
      e << "FILE option given filename \"" << this->Filename.GetString()
        << "\" which does not have an extension of \".cmake\".\n";
      this->SetError(e.str());
      return false;
      }
    fname = this->Filename.GetString();
    }

  // Get the file to write.
  if(cmSystemTools::FileIsFullPath(fname.c_str()))
    {
    if(!this->Makefile->CanIWriteThisFile(fname.c_str()))
      {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      this->SetError(e.str());
      return false;
      }
    }
  else
    {
    // Interpret relative paths with respect to the current build dir.
    std::string dir = this->Makefile->GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
    }

  std::vector<std::string> targets;

  cmGlobalGenerator *gg = this->Makefile->GetGlobalGenerator();

  if(args[0] == "EXPORT")
    {
    if (this->Append.IsEnabled())
      {
      std::ostringstream e;
      e << "EXPORT signature does not recognise the APPEND option.";
      this->SetError(e.str());
      return false;
      }

    if (this->ExportOld.IsEnabled())
      {
      std::ostringstream e;
      e << "EXPORT signature does not recognise the "
        "EXPORT_LINK_INTERFACE_LIBRARIES option.";
      this->SetError(e.str());
      return false;
      }

    cmExportSetMap &setMap = gg->GetExportSets();
    std::string setName = this->ExportSetName.GetString();
    if (setMap.find(setName) == setMap.end())
      {
      std::ostringstream e;
      e << "Export set \"" << setName << "\" not found.";
      this->SetError(e.str());
      return false;
      }
    this->ExportSet = setMap[setName];
    }
  else if (this->Targets.WasFound())
    {
    for(std::vector<std::string>::const_iterator
        currentTarget = this->Targets.GetVector().begin();
        currentTarget != this->Targets.GetVector().end();
        ++currentTarget)
      {
      if (this->Makefile->IsAlias(*currentTarget))
        {
        std::ostringstream e;
        e << "given ALIAS target \"" << *currentTarget
          << "\" which may not be exported.";
        this->SetError(e.str());
        return false;
        }

      if(cmTarget* target = gg->FindTarget(*currentTarget))
        {
        if(target->GetType() == cmTarget::OBJECT_LIBRARY)
          {
          std::ostringstream e;
          e << "given OBJECT library \"" << *currentTarget
            << "\" which may not be exported.";
          this->SetError(e.str());
          return false;
          }
        }
      else
        {
        std::ostringstream e;
        e << "given target \"" << *currentTarget
          << "\" which is not built by this project.";
        this->SetError(e.str());
        return false;
        }
      targets.push_back(*currentTarget);
      }
    if (this->Append.IsEnabled())
      {
      if (cmExportBuildFileGenerator *ebfg = gg->GetExportedTargetsFile(fname))
        {
        ebfg->AppendTargets(targets);
        return true;
        }
      }
    }
  else
    {
    this->SetError("EXPORT or TARGETS specifier missing.");
    return false;
    }

  // Setup export file generation.
  cmExportBuildFileGenerator *ebfg = new cmExportBuildFileGenerator;
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(this->Namespace.GetCString());
  ebfg->SetAppendMode(this->Append.IsEnabled());
  if (this->ExportSet)
    {
    ebfg->SetExportSet(this->ExportSet);
    }
  else
    {
    ebfg->SetTargets(targets);
    }
  ebfg->SetMakefile(this->Makefile);
  ebfg->SetExportOld(this->ExportOld.IsEnabled());

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes;
  this->Makefile->GetConfigurations(configurationTypes);
  if(configurationTypes.empty())
    {
    configurationTypes.push_back("");
    }
  for(std::vector<std::string>::const_iterator
        ci = configurationTypes.begin();
      ci != configurationTypes.end(); ++ci)
    {
    ebfg->AddConfiguration(*ci);
    }
  if (this->ExportSet)
    {
    gg->AddBuildExportExportSet(ebfg);
    }
  else
    {
    gg->AddBuildExportSet(ebfg);
    }

  return true;
}